

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
PossibleContentsTest_TestCombinations_Test::TestBody
          (PossibleContentsTest_TestCombinations_Test *this)

{
  PossibleContentsTest_TestCombinations_Test *this_local;
  
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).none,
             &(this->super_PossibleContentsTest).none);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).i32Zero,
             &(this->super_PossibleContentsTest).i32Zero);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).i32Global1
             ,&(this->super_PossibleContentsTest).i32Global1);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).exactI32,
             &(this->super_PossibleContentsTest).exactI32);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).many,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).i32Zero
             ,&(this->super_PossibleContentsTest).i32Zero);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).i32One,
             &(this->super_PossibleContentsTest).exactI32);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).f64One,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,
             &(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).exactI32);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,
             &(this->super_PossibleContentsTest).f64Global,&(this->super_PossibleContentsTest).many)
  ;
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,
             &(this->super_PossibleContentsTest).exactI32,
             &(this->super_PossibleContentsTest).exactI32);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,
             &(this->super_PossibleContentsTest).exactAnyref,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).many,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).i32Global1);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).i32Global2,
             &(this->super_PossibleContentsTest).exactI32);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).f64Global,&(this->super_PossibleContentsTest).many)
  ;
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).exactI32,
             &(this->super_PossibleContentsTest).exactI32);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).exactAnyref,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,&(this->super_PossibleContentsTest).many
             ,&(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactI32,
             &(this->super_PossibleContentsTest).exactI32,
             &(this->super_PossibleContentsTest).exactI32);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactI32,
             &(this->super_PossibleContentsTest).exactAnyref,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactI32,&(this->super_PossibleContentsTest).many,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).many,&(this->super_PossibleContentsTest).many,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactFuncref,
             &(this->super_PossibleContentsTest).exactAnyref,
             &(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactFuncref,
             &(this->super_PossibleContentsTest).anyGlobal,&(this->super_PossibleContentsTest).many)
  ;
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactFuncref,
             &(this->super_PossibleContentsTest).nonNullFunc,
             &(this->super_PossibleContentsTest).coneFuncref1);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactFuncref,
             &(this->super_PossibleContentsTest).exactFuncref,
             &(this->super_PossibleContentsTest).exactFuncref);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactFuncref,
             &(this->super_PossibleContentsTest).exactNonNullFuncref,
             &(this->super_PossibleContentsTest).exactFuncref);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,&(this->super_PossibleContentsTest).i32Zero
             ,&(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,&(this->super_PossibleContentsTest).anyNull
             ,&(this->super_PossibleContentsTest).anyNull);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,
             &(this->super_PossibleContentsTest).exactAnyref,
             &(this->super_PossibleContentsTest).exactAnyref);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,&(this->super_PossibleContentsTest).i31Null
             ,&(this->super_PossibleContentsTest).anyNull);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,
             &(this->super_PossibleContentsTest).funcNull,&(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactNonNullAnyref,
             &(this->super_PossibleContentsTest).exactNonNullAnyref,
             &(this->super_PossibleContentsTest).exactNonNullAnyref);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,
             &(this->super_PossibleContentsTest).exactNonNullAnyref,
             &(this->super_PossibleContentsTest).exactAnyref);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,
             &(this->super_PossibleContentsTest).exactNonNullI31ref,
             &(this->super_PossibleContentsTest).exactI31ref);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).nonNullFunc,
             &(this->super_PossibleContentsTest).funcNull,
             &(this->super_PossibleContentsTest).exactFuncSignatureType);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactFuncSignatureType,
             &(this->super_PossibleContentsTest).funcNull,
             &(this->super_PossibleContentsTest).exactFuncSignatureType);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactNonNullFuncSignatureType,
             &(this->super_PossibleContentsTest).funcNull,
             &(this->super_PossibleContentsTest).exactFuncSignatureType);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).nonNullFunc,
             &(this->super_PossibleContentsTest).exactFuncSignatureType,
             &(this->super_PossibleContentsTest).exactFuncSignatureType);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).nonNullFunc,
             &(this->super_PossibleContentsTest).exactNonNullFuncSignatureType,
             &(this->super_PossibleContentsTest).exactNonNullFuncSignatureType);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).nonNullFunc,
             &(this->super_PossibleContentsTest).exactI32,&(this->super_PossibleContentsTest).many);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyGlobal,
             &(this->super_PossibleContentsTest).anyNull,
             &(this->super_PossibleContentsTest).coneAnyref);
  assertCombination<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyGlobal,
             &(this->super_PossibleContentsTest).i31Null,
             &(this->super_PossibleContentsTest).coneAnyref);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestCombinations) {
  // None with anything else becomes the other thing.
  assertCombination(none, none, none);
  assertCombination(none, i32Zero, i32Zero);
  assertCombination(none, i32Global1, i32Global1);
  assertCombination(none, exactI32, exactI32);
  assertCombination(none, many, many);

  // i32(0) will become Many, unless the value or the type is identical.
  assertCombination(i32Zero, i32Zero, i32Zero);
  assertCombination(i32Zero, i32One, exactI32);
  assertCombination(i32Zero, f64One, many);
  assertCombination(i32Zero, i32Global1, exactI32);
  assertCombination(i32Zero, f64Global, many);
  assertCombination(i32Zero, exactI32, exactI32);
  assertCombination(i32Zero, exactAnyref, many);
  assertCombination(i32Zero, many, many);

  assertCombination(i32Global1, i32Global1, i32Global1);
  assertCombination(i32Global1, i32Global2, exactI32);
  assertCombination(i32Global1, f64Global, many);
  assertCombination(i32Global1, exactI32, exactI32);
  assertCombination(i32Global1, exactAnyref, many);
  assertCombination(i32Global1, many, many);

  assertCombination(exactI32, exactI32, exactI32);
  assertCombination(exactI32, exactAnyref, many);
  assertCombination(exactI32, many, many);

  assertCombination(many, many, many);

  // Exact references: An exact reference only stays exact when combined with
  // the same heap type (nullability may be added, but nothing else). Otherwise
  // we go to a cone type or to many.
  assertCombination(exactFuncref, exactAnyref, many);
  assertCombination(exactFuncref, anyGlobal, many);
  assertCombination(exactFuncref, nonNullFunc, coneFuncref1);
  assertCombination(exactFuncref, exactFuncref, exactFuncref);
  assertCombination(exactFuncref, exactNonNullFuncref, exactFuncref);

  // Nulls.

  assertCombination(anyNull, i32Zero, many);
  assertCombination(anyNull, anyNull, anyNull);
  assertCombination(anyNull, exactAnyref, exactAnyref);

  // Two nulls go to the lub.
  assertCombination(anyNull, i31Null, anyNull);

  // Incompatible nulls go to Many.
  assertCombination(anyNull, funcNull, many);

  assertCombination(exactNonNullAnyref, exactNonNullAnyref, exactNonNullAnyref);

  // If one is a null and the other is not, it makes the one that is not a
  // null be a nullable type - but keeps the heap type of the other (since the
  // type of the null does not matter, all nulls compare equal).
  assertCombination(anyNull, exactNonNullAnyref, exactAnyref);
  assertCombination(anyNull, exactNonNullI31ref, exactI31ref);

  // Funcrefs

  // A function reference + a null becomes an exact type (of that sig), plus
  // nullability.
  assertCombination(nonNullFunc, funcNull, exactFuncSignatureType);
  assertCombination(exactFuncSignatureType, funcNull, exactFuncSignatureType);
  assertCombination(
    exactNonNullFuncSignatureType, funcNull, exactFuncSignatureType);
  assertCombination(
    nonNullFunc, exactFuncSignatureType, exactFuncSignatureType);
  assertCombination(
    nonNullFunc, exactNonNullFuncSignatureType, exactNonNullFuncSignatureType);
  assertCombination(nonNullFunc, exactI32, many);

  // Globals vs nulls. The result is either the global or a null, so all we can
  // say is that it is something of the global's type, or a null: a cone.

  assertCombination(anyGlobal, anyNull, coneAnyref);
  assertCombination(anyGlobal, i31Null, coneAnyref);
}